

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::insert(Board *this,Block block,int idToInsert)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  
  if (idToInsert == -1) {
    idToInsert = block.id;
  }
  bVar1 = Block::isHorizontal(&block);
  if (bVar1) {
    lVar2 = (long)block.column;
    lVar3 = block.length + lVar2;
    for (; lVar2 < lVar3; lVar2 = lVar2 + 1) {
      this->cells[block.row][lVar2] = idToInsert;
    }
  }
  else {
    lVar2 = (long)block.row;
    lVar3 = lVar2 - block.length;
    piVar4 = this->cells[lVar2] + block.column;
    for (; lVar3 < lVar2; lVar2 = lVar2 + -1) {
      *piVar4 = idToInsert;
      piVar4 = piVar4 + -6;
    }
  }
  return;
}

Assistant:

void Board::insert(Block block, int idToInsert) {

    // If the ID is not specified, use the block's id.
    if (idToInsert == -1) {
        idToInsert = block.id;
    }

    // Insert the values into the 2D board array with IDs for move checks and visualization.
    if (block.isHorizontal()) {
        for (int i = block.column; i < block.column + block.length; ++i) {
            this->cells[block.row][i] = idToInsert;
        }
    } else {
        for (int i = block.row; i > block.row - block.length; --i) {
            this->cells[i][block.column] = idToInsert;
        }
    }
}